

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

Float pbrt::OwenScrambledRadicalInverse(int baseIndex,uint64_t a,uint32_t hash)

{
  uint32_t l;
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 in_XMM3 [16];
  
  uVar5 = 0;
  l = *(uint32_t *)(Primes + (long)baseIndex * 4);
  uVar4 = (ulong)(int)l;
  for (fVar6 = 1.0; 1.0 - fVar6 < 1.0; fVar6 = fVar6 * (1.0 / (float)(int)l)) {
    uVar3 = MixBits(uVar5 ^ hash);
    iVar2 = PermutationElement((uint32_t)(a % uVar4),l,(uint32_t)uVar3);
    uVar5 = uVar5 * uVar4 + (long)iVar2;
    a = a / uVar4;
  }
  auVar1 = vcvtusi2ss_avx512f(in_XMM3,uVar5);
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar6 * auVar1._0_4_)));
  return auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU inline Float OwenScrambledRadicalInverse(int baseIndex, uint64_t a,
                                                      uint32_t hash) {
    int base = Primes[baseIndex];
    Float invBase = (Float)1 / (Float)base, invBaseN = 1;
    uint64_t reversedDigits = 0;
    int digitIndex = 0;
    while (1 - invBaseN < 1) {
        uint64_t next = a / base;
        int digitValue = a - next * base;
        uint32_t digitHash = MixBits(hash ^ reversedDigits);
        digitValue = PermutationElement(digitValue, base, digitHash);
        reversedDigits = reversedDigits * base + digitValue;
        invBaseN *= invBase;
        ++digitIndex;
        a = next;
    }
    return std::min(invBaseN * reversedDigits, OneMinusEpsilon);
}